

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
psy::C::
List<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
::~List(List<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
        *this)

{
  void *in_RSI;
  List<psy::C::ExtGNU_AttributeSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AttributeSyntax_*>_>
  *this_local;
  
  ~List(this);
  Managed::operator_delete(&this->super_Managed,in_RSI);
  return;
}

Assistant:

class PSY_C_INTERNAL_API List : public Managed
{
public:
    List()
        : value(ValueT())
        , next(nullptr)
    {}

    List(const ValueT& value)
        : value(value)
        , next(nullptr)
    {}

    DerivedListT** skipToLast()
    {
        DerivedListT** cur = &next;
        while (*cur)
            cur = &(*cur)->next;
        return &(*cur);
    }

    ValueT lastValue() const
    {
        ValueT v = nullptr;
        for (auto it = const_cast<DerivedListT*>(static_cast<const DerivedListT*>(this));
                it;
                it = it->next) {
            if (it->value)
                v = it->value;
        }
        return v;
    }

    ValueT value;
    DerivedListT* next;

private:
    // Unavailable
    List(const List&) = delete;
    List& operator=(const List&) = delete;
}